

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::default_cost_type<double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (default_cost_type<double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double *pdVar5;
  ulong uVar6;
  pointer ppVar7;
  uint uVar8;
  pointer ppVar9;
  pointer ppVar10;
  undefined8 extraout_RAX;
  int i;
  int *piVar11;
  double *pdVar12;
  ulong uVar13;
  double *pdVar14;
  pointer ppVar15;
  long lVar16;
  double *pdVar17;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  pointer ppVar18;
  double dVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> r;
  allocator_type local_69;
  double local_68;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> local_60;
  uint local_44;
  default_cost_type<double> *local_40;
  ulong local_38;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  uVar6 = (ulong)(uint)n;
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::vector
            (&local_60,(long)n,&local_69);
  if (n != 0) {
    pdVar5 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    piVar11 = &(local_60.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->second;
    uVar13 = 0;
    do {
      ((pair<double,_int> *)(piVar11 + -2))->first = pdVar5[uVar13];
      *piVar11 = (int)uVar13;
      uVar13 = uVar13 + 1;
      piVar11 = piVar11 + 4;
    } while (uVar6 != uVar13);
  }
  ppVar7 = local_60.
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppVar15 = local_60.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVar10 = local_60.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar8 = n;
  local_40 = this;
  if (local_60.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_44 = n;
    local_38 = uVar6;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_60.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_60.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_60.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_60.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              ();
    ppVar7 = local_60.
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar15 = local_60.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppVar10 = local_60.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar8 = local_44;
    uVar6 = local_38;
  }
  for (; ppVar9 = local_60.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, local_44 = uVar8, local_38 = uVar6,
      ppVar7 != local_60.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar7 = ppVar7 + 1) {
    dVar1 = ppVar7->first;
    dVar19 = ppVar15->first;
    if (((dVar1 != dVar19) ||
        (ppVar18 = ppVar15,
        local_60.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar10, NAN(dVar1) || NAN(dVar19))) &&
       (ppVar18 = ppVar7,
       local_60.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish = ppVar10, 0x10 < (long)ppVar7 - (long)ppVar15)) {
      local_68 = dVar1 - dVar19;
      do {
        auVar20._0_8_ =
             std::
             generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                       (rng);
        auVar20._8_56_ = extraout_var;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_68;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = dVar19;
        auVar2 = vfmadd213sd_fma(auVar20._0_16_,auVar23,auVar2);
        ppVar15->first = auVar2._0_8_;
        ppVar15 = ppVar15 + 1;
      } while (ppVar15 != ppVar7);
    }
    ppVar15 = ppVar18;
    ppVar10 = local_60.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar8 = local_44;
    uVar6 = local_38;
    local_60.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar9;
  }
  if (0x10 < (long)local_60.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar15) {
    if ((long)ppVar15 -
        (long)local_60.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) {
      dVar1 = ppVar15->first;
      dVar19 = dVar1 + 1.0;
      if ((dVar1 == dVar19) && (!NAN(dVar1) && !NAN(dVar19))) goto LAB_001702eb;
      if (ppVar15 !=
          local_60.
          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_68 = dVar19 - dVar1;
        local_60.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar10;
        do {
          auVar22._0_8_ =
               std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar22._8_56_ = extraout_var_01;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = local_68;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = dVar1;
          auVar2 = vfmadd213sd_fma(auVar22._0_16_,auVar25,auVar4);
          ppVar15->first = auVar2._0_8_;
          ppVar15 = ppVar15 + 1;
          ppVar10 = local_60.
                    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (ppVar15 != ppVar9);
      }
    }
    else {
      local_60.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppVar10;
      dVar19 = linearize<long,double>
                         (0,(local_60.
                             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first,
                          (long)ppVar15 -
                          (long)local_60.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4,ppVar15->first,
                          (long)ppVar10 -
                          (long)local_60.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4);
      dVar1 = ppVar15->first;
      if ((dVar1 == dVar19) && (!NAN(dVar1) && !NAN(dVar19))) {
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
LAB_001702eb:
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
        if (local_60.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(extraout_RAX);
      }
      ppVar10 = local_60.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar15 != ppVar9) {
        local_68 = dVar19 - dVar1;
        do {
          auVar21._0_8_ =
               std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar21._8_56_ = extraout_var_00;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = local_68;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = dVar1;
          auVar2 = vfmadd213sd_fma(auVar21._0_16_,auVar24,auVar3);
          ppVar15->first = auVar2._0_8_;
          ppVar15 = ppVar15 + 1;
          ppVar10 = local_60.
                    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (ppVar15 != ppVar9);
      }
    }
  }
  local_60.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppVar10;
  ppVar7 = local_60.
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_60.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (local_60.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_60.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_60.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_60.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (ppVar7);
  }
  if (uVar8 != 0) {
    pdVar5 = (local_40->linear_elements)._M_t.
             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    lVar16 = 0;
    do {
      *(undefined8 *)((long)pdVar5 + lVar16) =
           *(undefined8 *)
            ((long)&(local_60.
                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first + lVar16 * 2);
      lVar16 = lVar16 + 8;
    } while (uVar6 * 8 - lVar16 != 0);
  }
  pdVar5 = (local_40->linear_elements)._M_t.
           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  pdVar14 = pdVar5;
  if (1 < uVar8) {
    lVar16 = (long)n * 8 + -8;
    pdVar17 = pdVar5;
    pdVar12 = pdVar5;
    do {
      pdVar12 = pdVar12 + 1;
      pdVar14 = pdVar12;
      if (*pdVar12 <= *pdVar17) {
        pdVar14 = pdVar17;
      }
      lVar16 = lVar16 + -8;
      pdVar17 = pdVar14;
    } while (lVar16 != 0);
  }
  dVar1 = *pdVar14;
  if (uVar8 != 0 && (uint)((ulong)((long)ABS(dVar1) + -0x10000000000000) >> 0x35) < 0x3ff) {
    uVar13 = 0;
    do {
      pdVar5[uVar13] = pdVar5[uVar13] / dVar1;
      uVar13 = uVar13 + 1;
    } while (uVar6 != uVar13);
  }
  if (local_60.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        auto begin = r.begin();
        auto end = r.end();
        auto next = r.begin()++;
        for (; next != end; ++next) {
            if (next->first != begin->first) {
                if (std::distance(begin, next) > 1)
                    random_epsilon_unique(
                      begin, next, rng, begin->first, next->first);

                begin = next;
            }
        }

        if (std::distance(begin, end) > 1) {
            if (begin == r.begin()) {
                random_epsilon_unique(
                  begin, end, rng, begin->first, begin->first + 1);
            } else {
                auto value = linearize(std::ptrdiff_t(0),
                                       r.front().first,
                                       std::distance(r.begin(), begin),
                                       begin->first,
                                       std::distance(r.begin(), r.end()));

                random_epsilon_unique(begin, end, rng, begin->first, value);
            }
        }

        // Reorder the vector according to the variable index, so, it
        // restores the initial order.

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.second < rhs.second;
        });

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;

        // Finally we compute the l+oo norm.

        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);
        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }